

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O3

unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_> *
__thiscall
ReachableNets::All(unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *__return_storage_ptr__,ReachableNets *this)

{
  size_t sVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  __alloc_node_gen_t __alloc_node_gen;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  _AllocNode<std::allocator<std::__detail::_Hash_node<Network,_false>_>_> local_30;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_28);
  (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_bucket_count = (this->m_reachable)._M_h._M_bucket_count;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = (this->m_reachable)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(this->m_reachable)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (this->m_reachable)._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor =
       (this->m_reachable)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy.field_0x4 = uVar2;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = sVar1;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_30._M_h = (__hashtable_alloc *)__return_storage_ptr__;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Network,false>>>>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)__return_storage_ptr__,&(this->m_reachable)._M_h,&local_30);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        AssertLockNotHeld(m_mutex);
        LOCK(m_mutex);
        return m_reachable;
    }